

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solvers.cpp
# Opt level: O1

vector<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>_> *
getPredefinedTransformations1Plane3Line<float>
          (vector<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>_>
           *__return_storage_ptr__,Matrix<float,_4,_1,_0,_4,_1> *Pi,Matrix<float,_4,_1,_0,_4,_1> *Nu
          ,bool verbose)

{
  float fVar1;
  iterator iVar2;
  double dVar3;
  CommaInitializer<Eigen::Matrix<float,_3,_3,_0,_3,_3>_> *pCVar4;
  CommaInitializer<Eigen::Matrix<float,_3,_1,_0,_3,_1>_> *pCVar5;
  long lVar6;
  ostream *poVar7;
  char *__function;
  DenseBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_> *pDVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  Matrix<float,_3,_1,_0,_3,_1> auxT;
  Matrix<float,_4,_4,_0,_4,_4> auxTrans;
  Matrix<float,_3,_3,_0,_3,_3> auxRot;
  CommaInitializer<Eigen::Matrix<float,_3,_3,_0,_3,_3>_> local_150;
  double local_130;
  float local_124;
  Scalar local_120;
  float local_11c;
  undefined1 local_118 [16];
  float local_100;
  float local_fc;
  float local_f8;
  float local_f4;
  float local_f0;
  float local_ec;
  float local_e8;
  float local_e4;
  float fStack_e0;
  float local_dc;
  Matrix<float,_4,_4,_0,_4,_4> local_d8;
  float local_98;
  uint uStack_94;
  uint uStack_90;
  uint uStack_8c;
  undefined1 local_88 [16];
  undefined1 local_78 [16];
  undefined1 local_68 [16];
  undefined4 local_54 [9];
  
  (__return_storage_ptr__->
  super__Vector_base<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_118 = ZEXT416((uint)(Pi->super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>).
                            m_storage.m_data.array[0]);
  fVar12 = (Pi->super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>).m_storage.m_data.array
           [1];
  fVar13 = (Pi->super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>).m_storage.m_data.array
           [2];
  local_100 = (Pi->super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>).m_storage.m_data.
              array[3];
  local_78 = ZEXT416((uint)(Nu->super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>).
                           m_storage.m_data.array[0]);
  fVar1 = (Nu->super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>).m_storage.m_data.array
          [1];
  local_88 = ZEXT416((uint)(Nu->super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>).
                           m_storage.m_data.array[2]);
  local_11c = (Nu->super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>).m_storage.m_data.
              array[3];
  pDVar8 = (DenseBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_> *)local_54;
  local_150.m_row = 0;
  local_150.m_col = 1;
  local_150.m_currentBlockRows = 1;
  local_54[0] = 0;
  local_68 = ZEXT416((uint)fVar13);
  local_130 = (double)CONCAT44(local_130._4_4_,fVar12 * fVar12);
  fVar9 = fVar12 * fVar12 + fVar13 * fVar13;
  local_150.m_xpr = (Matrix<float,_3,_3,_0,_3,_3> *)pDVar8;
  if (fVar9 < 0.0) {
    uStack_94 = 0x80000000;
    uStack_90 = 0x80000000;
    uStack_8c = 0x80000000;
    local_98 = -fVar13;
    fVar10 = sqrtf(fVar9);
    local_120 = local_98;
  }
  else {
    fVar10 = SQRT(fVar9);
    local_120 = -fVar13;
  }
  local_120 = local_120 / fVar10;
  pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>::operator_
                     (&local_150,&local_120);
  if (fVar9 < 0.0) {
    local_124 = sqrtf(fVar9);
  }
  else {
    local_124 = SQRT(fVar9);
  }
  local_124 = fVar12 / local_124;
  pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>::operator_
                     (pCVar4,&local_124);
  if (fVar9 < 0.0) {
    local_e8 = sqrtf(fVar9);
  }
  else {
    local_e8 = SQRT(fVar9);
  }
  fVar13 = fVar13 * fVar13 + (float)local_118._0_4_ * (float)local_118._0_4_ + local_130._0_4_;
  if (fVar13 < 0.0) {
    local_130 = (double)CONCAT44(local_130._4_4_,local_e8);
    fVar10 = sqrtf(fVar13);
    local_e8 = local_130._0_4_;
  }
  else {
    fVar10 = SQRT(fVar13);
  }
  local_e8 = local_e8 / fVar10;
  pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>::operator_
                     (pCVar4,&local_e8);
  local_98 = -(float)local_118._0_4_;
  uStack_94 = local_118._4_4_ ^ 0x80000000;
  uStack_90 = local_118._8_4_ ^ 0x80000000;
  uStack_8c = local_118._12_4_ ^ 0x80000000;
  if (fVar9 < 0.0) {
    local_130 = (double)(fVar12 * local_98);
    fVar10 = sqrtf(fVar9);
    dVar3 = local_130;
  }
  else {
    fVar10 = SQRT(fVar9);
    dVar3 = (double)(fVar12 * local_98);
  }
  if (fVar13 < 0.0) {
    local_130 = dVar3 / (double)fVar10;
    fVar11 = sqrtf(fVar13);
    dVar3 = local_130;
  }
  else {
    fVar11 = SQRT(fVar13);
    dVar3 = dVar3 / (double)fVar10;
  }
  local_ec = (float)(dVar3 / (double)fVar11);
  pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>::operator_
                     (pCVar4,&local_ec);
  fVar10 = local_98 * (float)local_68._0_4_;
  if (fVar9 < 0.0) {
    fVar9 = sqrtf(fVar9);
  }
  else {
    fVar9 = SQRT(fVar9);
  }
  if (fVar13 < 0.0) {
    local_f0 = sqrtf(fVar13);
  }
  else {
    local_f0 = SQRT(fVar13);
  }
  local_f0 = (fVar10 / fVar9) / local_f0;
  pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>::operator_
                     (pCVar4,&local_f0);
  if (fVar13 < 0.0) {
    local_f4 = sqrtf(fVar13);
  }
  else {
    local_f4 = SQRT(fVar13);
  }
  local_f4 = (float)local_118._0_4_ / local_f4;
  pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>::operator_
                     (pCVar4,&local_f4);
  if (fVar13 < 0.0) {
    local_f8 = sqrtf(fVar13);
  }
  else {
    local_f8 = SQRT(fVar13);
  }
  local_f8 = fVar12 / local_f8;
  pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>::operator_
                     (pCVar4,&local_f8);
  if (fVar13 < 0.0) {
    local_fc = sqrtf(fVar13);
  }
  else {
    local_fc = SQRT(fVar13);
  }
  local_fc = (float)local_68._0_4_ / local_fc;
  Eigen::CommaInitializer<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>::operator_(pCVar4,&local_fc);
  if (((DenseBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_> *)
       (local_150.m_row + local_150.m_currentBlockRows) ==
       (DenseBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_> *)0x3) && (local_150.m_col == 3)) {
    local_150.m_row = 0;
    local_150.m_col = 1;
    local_150.m_currentBlockRows = 1;
    local_e4 = 0.0;
    local_120 = 0.0;
    local_150.m_xpr = (Matrix<float,_3,_3,_0,_3,_3> *)&local_e4;
    pCVar5 = Eigen::CommaInitializer<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>::operator_
                       ((CommaInitializer<Eigen::Matrix<float,_3,_1,_0,_3,_1>_> *)&local_150,
                        &local_120);
    if (fVar13 < 0.0) {
      fVar13 = sqrtf(fVar13);
    }
    else {
      fVar13 = SQRT(fVar13);
    }
    local_124 = local_100 * fVar13;
    Eigen::CommaInitializer<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>::operator_(pCVar5,&local_124);
    if (((DenseBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_> *)
         (local_150.m_row + local_150.m_currentBlockRows) ==
         (DenseBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_> *)0x3) && (local_150.m_col == 1)) {
      local_d8.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[0]
           = 1.0;
      local_d8.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[1]
           = 0.0;
      local_d8.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[2]
           = 0.0;
      local_d8.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[3]
           = 0.0;
      local_d8.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[4]
           = 0.0;
      local_d8.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[5]
           = 1.0;
      local_d8.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[6]
           = 0.0;
      local_d8.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[7]
           = 0.0;
      local_d8.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[8]
           = 0.0;
      local_d8.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[9]
           = 0.0;
      local_d8.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
      [10] = 1.0;
      local_d8.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
      [0xb] = 0.0;
      local_d8.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
      [0xf] = 1.0;
      lVar6 = 0;
      do {
        *(undefined4 *)
         ((long)local_d8.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.
                m_data.array + lVar6 + 8) = *(undefined4 *)(pDVar8 + 8);
        *(undefined8 *)
         ((long)local_d8.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.
                m_data.array + lVar6) = *(undefined8 *)pDVar8;
        pDVar8 = pDVar8 + 0xc;
        lVar6 = lVar6 + 0x10;
      } while (lVar6 != 0x30);
      local_d8.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
      [0xe] = local_dc;
      local_d8.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
      [0xc] = local_e4;
      local_d8.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
      [0xd] = fStack_e0;
      if (verbose) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"[VERBOSE] Matrix [U,u;0,0,0,1]",0x1e);
        std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'x');
        std::ostream::put('x');
        poVar7 = (ostream *)std::ostream::flush();
        poVar7 = Eigen::operator<<(poVar7,(DenseBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_> *)
                                          &local_d8);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
        std::ostream::put((char)poVar7);
        std::ostream::flush();
        if (verbose) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,"[VERBOSE] inv(T)*T = eye(3)",0x1b);
          std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'x');
          std::ostream::put('x');
          poVar7 = (ostream *)std::ostream::flush();
          local_150.m_xpr = (Matrix<float,_3,_3,_0,_3,_3> *)&local_d8;
          local_150.m_row = (Index)&local_d8;
          poVar7 = Eigen::operator<<(poVar7,(DenseBase<Eigen::Product<Eigen::Inverse<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>,_Eigen::Matrix<float,_4,_4,_0,_4,_4>,_0>_>
                                             *)&local_150);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
          std::ostream::put((char)poVar7);
          std::ostream::flush();
        }
      }
      iVar2._M_current =
           (__return_storage_ptr__->
           super__Vector_base<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
      if (iVar2._M_current ==
          (__return_storage_ptr__->
          super__Vector_base<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>_>
          )._M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::vector<Eigen::Matrix<float,4,4,0,4,4>,std::allocator<Eigen::Matrix<float,4,4,0,4,4>>>::
        _M_realloc_insert<Eigen::Matrix<float,4,4,0,4,4>const&>
                  ((vector<Eigen::Matrix<float,4,4,0,4,4>,std::allocator<Eigen::Matrix<float,4,4,0,4,4>>>
                    *)__return_storage_ptr__,iVar2,&local_d8);
      }
      else {
        *(ulong *)(((iVar2._M_current)->super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>)
                   .m_storage.m_data.array + 0xc) =
             CONCAT44(local_d8.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage
                      .m_data.array[0xd],
                      local_d8.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage
                      .m_data.array[0xc]);
        *(ulong *)(((iVar2._M_current)->super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>)
                   .m_storage.m_data.array + 0xe) =
             CONCAT44(local_d8.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage
                      .m_data.array[0xf],
                      local_d8.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage
                      .m_data.array[0xe]);
        *(undefined8 *)
         (((iVar2._M_current)->super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>).
          m_storage.m_data.array + 8) =
             local_d8.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.
             array._32_8_;
        *(ulong *)(((iVar2._M_current)->super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>)
                   .m_storage.m_data.array + 10) =
             CONCAT44(local_d8.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage
                      .m_data.array[0xb],
                      local_d8.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage
                      .m_data.array[10]);
        *(ulong *)(((iVar2._M_current)->super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>)
                   .m_storage.m_data.array + 4) =
             CONCAT44(local_d8.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage
                      .m_data.array[5],
                      local_d8.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage
                      .m_data.array[4]);
        *(undefined8 *)
         (((iVar2._M_current)->super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>).
          m_storage.m_data.array + 6) =
             local_d8.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.
             array._24_8_;
        *(ulong *)((iVar2._M_current)->super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>).
                  m_storage.m_data.array =
             CONCAT44(local_d8.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage
                      .m_data.array[1],
                      local_d8.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage
                      .m_data.array[0]);
        *(ulong *)(((iVar2._M_current)->super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>)
                   .m_storage.m_data.array + 2) =
             CONCAT44(local_d8.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage
                      .m_data.array[3],
                      local_d8.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage
                      .m_data.array[2]);
        (__return_storage_ptr__->
        super__Vector_base<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>_>
        )._M_impl.super__Vector_impl_data._M_finish = iVar2._M_current + 1;
      }
      pDVar8 = (DenseBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_> *)local_54;
      local_150.m_row = 0;
      local_150.m_col = 1;
      local_150.m_currentBlockRows = 1;
      local_54[0] = 0;
      fVar13 = (float)local_88._0_4_ * (float)local_88._0_4_;
      fVar12 = fVar1 * fVar1 + fVar13;
      local_150.m_xpr = (Matrix<float,_3,_3,_0,_3,_3> *)pDVar8;
      if (fVar12 < 0.0) {
        local_118._0_8_ = local_88._0_8_ ^ 0x8000000080000000;
        local_118._8_4_ = local_88._8_4_ ^ 0x80000000;
        local_118._12_4_ = local_88._12_4_ ^ 0x80000000;
        fVar9 = sqrtf(fVar12);
        local_120 = (Scalar)local_118._0_4_;
      }
      else {
        fVar9 = SQRT(fVar12);
        local_120 = -(float)local_88._0_4_;
      }
      local_120 = local_120 / fVar9;
      pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>::operator_
                         (&local_150,&local_120);
      if (fVar12 < 0.0) {
        local_124 = sqrtf(fVar12);
      }
      else {
        local_124 = SQRT(fVar12);
      }
      local_124 = fVar1 / local_124;
      pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>::operator_
                         (pCVar4,&local_124);
      if (fVar12 < 0.0) {
        fVar9 = sqrtf(fVar12);
      }
      else {
        fVar9 = SQRT(fVar12);
      }
      fVar13 = fVar13 + (float)local_78._0_4_ * (float)local_78._0_4_ + fVar1 * fVar1;
      if (fVar13 < 0.0) {
        local_e8 = sqrtf(fVar13);
      }
      else {
        local_e8 = SQRT(fVar13);
      }
      local_e8 = fVar9 / local_e8;
      pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>::operator_
                         (pCVar4,&local_e8);
      fVar9 = -(float)local_78._0_4_;
      local_118._0_8_ = CONCAT44(local_78._4_4_,fVar9) ^ 0x8000000000000000;
      local_118._8_4_ = local_78._8_4_ ^ 0x80000000;
      local_118._12_4_ = local_78._12_4_ ^ 0x80000000;
      if (fVar12 < 0.0) {
        fVar10 = sqrtf(fVar12);
      }
      else {
        fVar10 = SQRT(fVar12);
      }
      if (fVar13 < 0.0) {
        local_ec = sqrtf(fVar13);
      }
      else {
        local_ec = SQRT(fVar13);
      }
      local_ec = ((fVar1 * fVar9) / fVar10) / local_ec;
      pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>::operator_
                         (pCVar4,&local_ec);
      fVar9 = (float)local_118._0_4_ * (float)local_88._0_4_;
      if (fVar12 < 0.0) {
        fVar12 = sqrtf(fVar12);
      }
      else {
        fVar12 = SQRT(fVar12);
      }
      if (fVar13 < 0.0) {
        local_f0 = sqrtf(fVar13);
      }
      else {
        local_f0 = SQRT(fVar13);
      }
      local_f0 = (fVar9 / fVar12) / local_f0;
      pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>::operator_
                         (pCVar4,&local_f0);
      if (fVar13 < 0.0) {
        local_f4 = sqrtf(fVar13);
      }
      else {
        local_f4 = SQRT(fVar13);
      }
      local_f4 = (float)local_78._0_4_ / local_f4;
      pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>::operator_
                         (pCVar4,&local_f4);
      if (fVar13 < 0.0) {
        local_f8 = sqrtf(fVar13);
      }
      else {
        local_f8 = SQRT(fVar13);
      }
      local_f8 = fVar1 / local_f8;
      pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>::operator_
                         (pCVar4,&local_f8);
      if (fVar13 < 0.0) {
        local_fc = sqrtf(fVar13);
      }
      else {
        local_fc = SQRT(fVar13);
      }
      local_fc = (float)local_88._0_4_ / local_fc;
      Eigen::CommaInitializer<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>::operator_(pCVar4,&local_fc);
      if (((DenseBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_> *)
           (local_150.m_row + local_150.m_currentBlockRows) !=
           (DenseBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_> *)0x3) || (local_150.m_col != 3))
      goto LAB_0014be90;
      local_150.m_row = 0;
      local_150.m_col = 1;
      local_150.m_currentBlockRows = 1;
      local_e4 = 0.0;
      local_120 = 0.0;
      local_150.m_xpr = (Matrix<float,_3,_3,_0,_3,_3> *)&local_e4;
      pCVar5 = Eigen::CommaInitializer<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>::operator_
                         ((CommaInitializer<Eigen::Matrix<float,_3,_1,_0,_3,_1>_> *)&local_150,
                          &local_120);
      if (fVar13 < 0.0) {
        fVar13 = sqrtf(fVar13);
      }
      else {
        fVar13 = SQRT(fVar13);
      }
      local_124 = local_11c * fVar13;
      Eigen::CommaInitializer<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>::operator_(pCVar5,&local_124);
      if (((DenseBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_> *)
           (local_150.m_row + local_150.m_currentBlockRows) ==
           (DenseBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_> *)0x3) && (local_150.m_col == 1)) {
        local_d8.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
        [0] = 1.0;
        local_d8.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
        [1] = 0.0;
        local_d8.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
        [2] = 0.0;
        local_d8.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
        [3] = 0.0;
        local_d8.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
        [4] = 0.0;
        local_d8.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
        [5] = 1.0;
        local_d8.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
        [6] = 0.0;
        local_d8.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
        [7] = 0.0;
        local_d8.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
        [8] = 0.0;
        local_d8.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
        [9] = 0.0;
        local_d8.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
        [10] = 1.0;
        local_d8.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
        [0xb] = 0.0;
        local_d8.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
        [0xf] = 1.0;
        lVar6 = 0;
        do {
          *(undefined4 *)
           ((long)local_d8.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.
                  m_data.array + lVar6 + 8) = *(undefined4 *)(pDVar8 + 8);
          *(undefined8 *)
           ((long)local_d8.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.
                  m_data.array + lVar6) = *(undefined8 *)pDVar8;
          pDVar8 = pDVar8 + 0xc;
          lVar6 = lVar6 + 0x10;
        } while (lVar6 != 0x30);
        local_d8.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
        [0xe] = local_dc;
        local_d8.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
        [0xc] = local_e4;
        local_d8.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
        [0xd] = fStack_e0;
        if (verbose) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,"[VERBOSE] Matrix [V,v;0,0,0,1]",0x1e);
          std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'x');
          std::ostream::put('x');
          poVar7 = (ostream *)std::ostream::flush();
          poVar7 = Eigen::operator<<(poVar7,(DenseBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_> *)
                                            &local_d8);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
          std::ostream::put((char)poVar7);
          std::ostream::flush();
          if (verbose) {
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cout,"[VERBOSE] inv(T)*T = eye(3)",0x1b);
            std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'x');
            std::ostream::put('x');
            poVar7 = (ostream *)std::ostream::flush();
            local_150.m_xpr = (Matrix<float,_3,_3,_0,_3,_3> *)&local_d8;
            local_150.m_row = (Index)&local_d8;
            poVar7 = Eigen::operator<<(poVar7,(DenseBase<Eigen::Product<Eigen::Inverse<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>,_Eigen::Matrix<float,_4,_4,_0,_4,_4>,_0>_>
                                               *)&local_150);
            std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
            std::ostream::put((char)poVar7);
            std::ostream::flush();
          }
        }
        iVar2._M_current =
             (__return_storage_ptr__->
             super__Vector_base<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>_>
             )._M_impl.super__Vector_impl_data._M_finish;
        if (iVar2._M_current ==
            (__return_storage_ptr__->
            super__Vector_base<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>_>
            )._M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::vector<Eigen::Matrix<float,4,4,0,4,4>,std::allocator<Eigen::Matrix<float,4,4,0,4,4>>>
          ::_M_realloc_insert<Eigen::Matrix<float,4,4,0,4,4>const&>
                    ((vector<Eigen::Matrix<float,4,4,0,4,4>,std::allocator<Eigen::Matrix<float,4,4,0,4,4>>>
                      *)__return_storage_ptr__,iVar2,&local_d8);
        }
        else {
          *(ulong *)(((iVar2._M_current)->
                     super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>).m_storage.m_data.
                     array + 0xc) =
               CONCAT44(local_d8.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.
                        m_storage.m_data.array[0xd],
                        local_d8.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.
                        m_storage.m_data.array[0xc]);
          *(ulong *)(((iVar2._M_current)->
                     super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>).m_storage.m_data.
                     array + 0xe) =
               CONCAT44(local_d8.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.
                        m_storage.m_data.array[0xf],
                        local_d8.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.
                        m_storage.m_data.array[0xe]);
          *(undefined8 *)
           (((iVar2._M_current)->super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>).
            m_storage.m_data.array + 8) =
               local_d8.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data
               .array._32_8_;
          *(ulong *)(((iVar2._M_current)->
                     super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>).m_storage.m_data.
                     array + 10) =
               CONCAT44(local_d8.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.
                        m_storage.m_data.array[0xb],
                        local_d8.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.
                        m_storage.m_data.array[10]);
          *(ulong *)(((iVar2._M_current)->
                     super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>).m_storage.m_data.
                     array + 4) =
               CONCAT44(local_d8.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.
                        m_storage.m_data.array[5],
                        local_d8.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.
                        m_storage.m_data.array[4]);
          *(undefined8 *)
           (((iVar2._M_current)->super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>).
            m_storage.m_data.array + 6) =
               local_d8.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data
               .array._24_8_;
          *(ulong *)((iVar2._M_current)->super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>
                    ).m_storage.m_data.array =
               CONCAT44(local_d8.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.
                        m_storage.m_data.array[1],
                        local_d8.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.
                        m_storage.m_data.array[0]);
          *(ulong *)(((iVar2._M_current)->
                     super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>).m_storage.m_data.
                     array + 2) =
               CONCAT44(local_d8.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.
                        m_storage.m_data.array[3],
                        local_d8.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.
                        m_storage.m_data.array[2]);
          (__return_storage_ptr__->
          super__Vector_base<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>_>
          )._M_impl.super__Vector_impl_data._M_finish = iVar2._M_current + 1;
        }
        return __return_storage_ptr__;
      }
    }
    __function = 
    "XprType &Eigen::CommaInitializer<Eigen::Matrix<float, 3, 1>>::finished() [MatrixType = Eigen::Matrix<float, 3, 1>]"
    ;
  }
  else {
LAB_0014be90:
    __function = 
    "XprType &Eigen::CommaInitializer<Eigen::Matrix<float, 3, 3>>::finished() [MatrixType = Eigen::Matrix<float, 3, 3>]"
    ;
  }
  __assert_fail("((m_row+m_currentBlockRows) == m_xpr.rows() || m_xpr.cols() == 0) && m_col == m_xpr.cols() && \"Too few coefficients passed to comma initializer (operator<<)\""
                ,"/usr/include/eigen3/Eigen/src/Core/CommaInitializer.h",0x7c,__function);
}

Assistant:

vector<Matrix<floatPrec, 4, 4>> getPredefinedTransformations1Plane3Line(
	Matrix<floatPrec, 4, 1> Pi, Matrix<floatPrec, 4, 1> Nu,
	bool verbose)
{

	vector<Matrix<floatPrec, 4, 4>> outTrans;
	Matrix<floatPrec, 4, 4> auxTrans;
	Matrix<floatPrec, 3, 3> auxRot;
	Matrix<floatPrec, 3, 1> auxT;

	floatPrec pi11, pi12, pi13, pi14;
	floatPrec nu11, nu12, nu13, nu14;

	pi11 = Pi(0);
	pi12 = Pi(1);
	pi13 = Pi(2);
	pi14 = Pi(3);
	nu11 = Nu(0);
	nu12 = Nu(1);
	nu13 = Nu(2);
	nu14 = Nu(3);

	// Compute U Matrix
	auxRot << 0.0,
		-pi13 * 1.0 / sqrt(pi12 * pi12 + pi13 * pi13),
		pi12 * 1.0 / sqrt(pi12 * pi12 + pi13 * pi13),
		sqrt(pi12 * pi12 + pi13 * pi13) * 1.0 / sqrt(pi11 * pi11 + pi12 * pi12 + pi13 * pi13),
		-pi11 * pi12 * 1.0 / sqrt(pi12 * pi12 + pi13 * pi13) * 1.0 / sqrt(pi11 * pi11 + pi12 * pi12 + pi13 * pi13),
		-pi11 * pi13 * 1.0 / sqrt(pi12 * pi12 + pi13 * pi13) * 1.0 / sqrt(pi11 * pi11 + pi12 * pi12 + pi13 * pi13),
		pi11 * 1.0 / sqrt(pi11 * pi11 + pi12 * pi12 + pi13 * pi13),
		pi12 * 1.0 / sqrt(pi11 * pi11 + pi12 * pi12 + pi13 * pi13),
		pi13 * 1.0 / sqrt(pi11 * pi11 + pi12 * pi12 + pi13 * pi13);

	// Compute u vector
	auxT << 0.0, 0.0, pi14 * sqrt(pi11 * pi11 + pi12 * pi12 + pi13 * pi13);

	auxTrans = Matrix<floatPrec, 4, 4>::Identity(4, 4);
	auxTrans.topLeftCorner(3, 3) = auxRot;
	auxTrans.topRightCorner(3, 1) = auxT;

	if (verbose)
		cout << "[VERBOSE] Matrix [U,u;0,0,0,1]" << endl
			 << auxTrans << endl;
	if (verbose)
		cout << "[VERBOSE] inv(T)*T = eye(3)" << endl
			 << auxTrans.inverse() * auxTrans << endl;

	// add U,u to the output vector
	outTrans.push_back(auxTrans);

	// Compute V Matrix
	auxRot << 0.0,
		-nu13 * 1.0 / sqrt(nu12 * nu12 + nu13 * nu13),
		nu12 * 1.0 / sqrt(nu12 * nu12 + nu13 * nu13),
		sqrt(nu12 * nu12 + nu13 * nu13) * 1.0 / sqrt(nu11 * nu11 + nu12 * nu12 + nu13 * nu13),
		-nu11 * nu12 * 1.0 / sqrt(nu12 * nu12 + nu13 * nu13) * 1.0 / sqrt(nu11 * nu11 + nu12 * nu12 + nu13 * nu13),
		-nu11 * nu13 * 1.0 / sqrt(nu12 * nu12 + nu13 * nu13) * 1.0 / sqrt(nu11 * nu11 + nu12 * nu12 + nu13 * nu13),
		nu11 * 1.0 / sqrt(nu11 * nu11 + nu12 * nu12 + nu13 * nu13),
		nu12 * 1.0 / sqrt(nu11 * nu11 + nu12 * nu12 + nu13 * nu13),
		nu13 * 1.0 / sqrt(nu11 * nu11 + nu12 * nu12 + nu13 * nu13);

	// Compute v vector
	auxT << 0.0, 0.0, nu14 * sqrt(nu11 * nu11 + nu12 * nu12 + nu13 * nu13);

	auxTrans = Matrix<floatPrec, 4, 4>::Identity(4, 4);
	auxTrans.topLeftCorner(3, 3) = auxRot;
	auxTrans.topRightCorner(3, 1) = auxT;

	if (verbose)
		cout << "[VERBOSE] Matrix [V,v;0,0,0,1]" << endl
			 << auxTrans << endl;
	if (verbose)
		cout << "[VERBOSE] inv(T)*T = eye(3)" << endl
			 << auxTrans.inverse() * auxTrans << endl;

	// add V,v to the output vector
	outTrans.push_back(auxTrans);

	return outTrans;
}